

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_log.cpp
# Opt level: O3

int miniros::file_log::init(EVP_PKEY_CTX *ctx)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  const_iterator cVar7;
  long *plVar8;
  string *psVar9;
  size_t sVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  undefined8 uVar13;
  size_t i;
  ulong uVar14;
  path log_file_name_1;
  string log_file_name;
  string ros_log_env;
  char pid_str [100];
  path local_188;
  path local_160;
  string_type local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  path local_d8 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_d8[0]._M_pathname.field_2;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_d8[0]._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"__log","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)ctx,&local_d8[0]._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8[0]._M_pathname._M_dataplus._M_p,
                    local_d8[0]._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (cVar7._M_node != (_Base_ptr)(ctx + 8)) {
    std::__cxx11::string::_M_assign((string *)&local_118);
  }
  if (local_118._M_string_length != 0) goto LAB_001cae64;
  uVar5 = getpid();
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  bVar4 = get_environment_variable(&local_f8,"ROS_LOG_DIR");
  if (bVar4) {
    local_188._M_pathname._M_dataplus._M_p = (pointer)&local_188._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/","");
    plVar8 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_188,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
LAB_001ca9a3:
    psVar12 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_d8[0]._M_pathname.field_2._0_8_ = *psVar12;
      local_d8[0]._M_pathname.field_2._8_8_ = plVar8[3];
      local_d8[0]._M_pathname._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d8[0]._M_pathname.field_2._0_8_ = *psVar12;
      local_d8[0]._M_pathname._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d8[0]._M_pathname._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_118,(string *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8[0]._M_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8[0]._M_pathname._M_dataplus._M_p,
                      local_d8[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_pathname._M_dataplus._M_p != &local_188._M_pathname.field_2) {
      operator_delete(local_188._M_pathname._M_dataplus._M_p,
                      local_188._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = get_environment_variable(&local_f8,"ROS_HOME");
    if (bVar4) {
      local_188._M_pathname._M_dataplus._M_p = (pointer)&local_188._M_pathname.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/log/","");
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_188,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
      goto LAB_001ca9a3;
    }
    bVar4 = get_environment_variable(&local_f8,"HOME");
    if (bVar4) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_188,&local_f8,auto_format);
      paVar2 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,".ros","");
      std::filesystem::__cxx11::path::path(&local_160,&local_138,auto_format);
      std::filesystem::__cxx11::operator/(local_d8,&local_188,&local_160);
      std::filesystem::__cxx11::path::~path(&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_188);
      std::filesystem::create_directory(local_d8);
      local_138._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"log","");
      std::filesystem::__cxx11::path::path(&local_160,&local_138,auto_format);
      std::filesystem::__cxx11::operator/(&local_188,local_d8,&local_160);
      std::filesystem::__cxx11::path::~path(&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::create_directory(&local_188);
      std::filesystem::__cxx11::path::~path(&local_188);
      std::filesystem::__cxx11::path::~path(local_d8);
    }
  }
  for (uVar14 = 1; psVar9 = this_node::getName_abi_cxx11_(), uVar14 < psVar9->_M_string_length;
      uVar14 = uVar14 + 1) {
    psVar9 = this_node::getName_abi_cxx11_();
    iVar6 = isalnum((int)(psVar9->_M_dataplus)._M_p[uVar14]);
    if (iVar6 != 0) {
      this_node::getName_abi_cxx11_();
    }
    std::__cxx11::string::push_back((char)&local_118);
  }
  snprintf((char *)local_d8,100,"%d",(ulong)uVar5);
  paVar2 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"_","");
  local_50 = local_40;
  sVar10 = strlen((char *)local_d8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,local_d8,(long)&local_d8[0]._M_pathname._M_dataplus._M_p + sVar10);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    uVar13 = local_138.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_48 + local_138._M_string_length) {
    uVar14 = 0xf;
    if (local_50 != local_40) {
      uVar14 = local_40[0];
    }
    if (uVar14 < local_48 + local_138._M_string_length) goto LAB_001cac77;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_50,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
  }
  else {
LAB_001cac77:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_50);
  }
  local_160._M_pathname._M_dataplus._M_p = (pointer)&local_160._M_pathname.field_2;
  puVar1 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_160._M_pathname.field_2._M_allocated_capacity = *puVar1;
    local_160._M_pathname.field_2._8_4_ = *(undefined4 *)(puVar11 + 3);
    local_160._M_pathname.field_2._12_4_ = *(undefined4 *)((long)puVar11 + 0x1c);
  }
  else {
    local_160._M_pathname.field_2._M_allocated_capacity = *puVar1;
    local_160._M_pathname._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_160._M_pathname._M_string_length = puVar11[1];
  *puVar11 = puVar1;
  puVar11[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".log","");
  paVar3 = &local_160._M_pathname.field_2;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_pathname._M_dataplus._M_p != paVar3) {
    uVar13 = local_160._M_pathname.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_68 + local_160._M_pathname._M_string_length) {
    uVar14 = 0xf;
    if (local_70 != local_60) {
      uVar14 = local_60[0];
    }
    if (uVar14 < local_68 + local_160._M_pathname._M_string_length) goto LAB_001cad4e;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_70,0,(char *)0x0,
                         (ulong)local_160._M_pathname._M_dataplus._M_p);
  }
  else {
LAB_001cad4e:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_70);
  }
  local_188._M_pathname._M_dataplus._M_p = (pointer)&local_188._M_pathname.field_2;
  psVar12 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_188._M_pathname.field_2._M_allocated_capacity = *psVar12;
    local_188._M_pathname.field_2._8_8_ = puVar11[3];
  }
  else {
    local_188._M_pathname.field_2._M_allocated_capacity = *psVar12;
    local_188._M_pathname._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_188._M_pathname._M_string_length = puVar11[1];
  *puVar11 = psVar12;
  puVar11[1] = 0;
  *(undefined1 *)psVar12 = 0;
  std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_188._M_pathname._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_pathname._M_dataplus._M_p != &local_188._M_pathname.field_2) {
    operator_delete(local_188._M_pathname._M_dataplus._M_p,
                    local_188._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_pathname._M_dataplus._M_p,
                    local_160._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
LAB_001cae64:
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_188,&local_118,auto_format);
  std::filesystem::absolute(local_d8);
  paVar2 = &local_160._M_pathname.field_2;
  local_160._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,local_d8[0]._M_pathname._M_dataplus._M_p,
             local_d8[0]._M_pathname._M_dataplus._M_p + local_d8[0]._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_pathname._M_dataplus._M_p,
                    local_160._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(local_d8);
  std::filesystem::__cxx11::path::~path(&local_188);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_188,&local_118,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  local_160._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,local_d8[0]._M_pathname._M_dataplus._M_p,
             local_d8[0]._M_pathname._M_dataplus._M_p + local_d8[0]._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)&g_log_directory_abi_cxx11_,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_pathname._M_dataplus._M_p,
                    local_160._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(local_d8);
  std::filesystem::__cxx11::path::~path(&local_188);
  iVar6 = extraout_EAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
    iVar6 = extraout_EAX_00;
  }
  return iVar6;
}

Assistant:

void init(const M_string& remappings)
{
  std::string log_file_name;
  M_string::const_iterator it = remappings.find("__log");
  if (it != remappings.end())
  {
    log_file_name = it->second;
  }

  {
    // Log filename can be specified on the command line through __log
    // If it's been set, don't create our own name
    if (log_file_name.empty())
    {
      // Setup the logfile appender
      // Can't do this in rosconsole because the node name is not known
      pid_t pid = getpid();
      std::string ros_log_env;
      if ( get_environment_variable(ros_log_env, "ROS_LOG_DIR"))
      {
        log_file_name = ros_log_env + std::string("/");
      }
      else
      {
        if ( get_environment_variable(ros_log_env, "ROS_HOME"))
        {
          log_file_name = ros_log_env + std::string("/log/");
        }
        else
        {
          // Not cross-platform?
          if( get_environment_variable(ros_log_env, "HOME") )
          {
            fs::path dotros = fs::path(ros_log_env) / std::string(".ros");
            fs::create_directory(dotros);
            fs::path log_file_name = dotros / std::string("log");
            fs::create_directory(log_file_name);
          }
        }
      }

      // sanitize the node name and tack it to the filename
      for (size_t i = 1; i < this_node::getName().length(); i++)
      {
        if (!isalnum(this_node::getName()[i]))
        {
          log_file_name += '_';
        }
        else
        {
          log_file_name += this_node::getName()[i];
        }
      }

      char pid_str[100];
      std::snprintf(pid_str, sizeof(pid_str), "%d", pid);
      log_file_name += std::string("_") + std::string(pid_str) + std::string(".log");
    }

    log_file_name = fs::absolute(log_file_name).string();
    g_log_directory = fs::path(log_file_name).parent_path().string();
  }
}